

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttsbit.c
# Opt level: O0

FT_Error tt_sbit_decoder_alloc_bitmap(TT_SBitDecoder decoder,FT_Bool metrics_only)

{
  ushort uVar1;
  FT_Bitmap *pFVar2;
  FT_ULong size_00;
  FT_ULong size;
  FT_Bitmap *map;
  FT_UInt height;
  FT_UInt width;
  FT_Error error;
  FT_Bool metrics_only_local;
  TT_SBitDecoder decoder_local;
  
  height = 0;
  pFVar2 = decoder->bitmap;
  if (decoder->metrics_loaded == '\0') {
    height = 6;
  }
  else {
    uVar1 = decoder->metrics->height;
    pFVar2->width = (uint)decoder->metrics->width;
    pFVar2->rows = (uint)uVar1;
    switch(decoder->bit_depth) {
    case '\x01':
      pFVar2->pixel_mode = '\x01';
      pFVar2->pitch = pFVar2->width + 7 >> 3;
      pFVar2->num_grays = 2;
      break;
    case '\x02':
      pFVar2->pixel_mode = '\x03';
      pFVar2->pitch = pFVar2->width + 3 >> 2;
      pFVar2->num_grays = 4;
      break;
    default:
      return 3;
    case '\x04':
      pFVar2->pixel_mode = '\x04';
      pFVar2->pitch = pFVar2->width + 1 >> 1;
      pFVar2->num_grays = 0x10;
      break;
    case '\b':
      pFVar2->pixel_mode = '\x02';
      pFVar2->pitch = pFVar2->width;
      pFVar2->num_grays = 0x100;
      break;
    case ' ':
      pFVar2->pixel_mode = '\a';
      pFVar2->pitch = pFVar2->width << 2;
      pFVar2->num_grays = 0x100;
    }
    size_00 = (ulong)pFVar2->rows * (long)pFVar2->pitch;
    if (((size_00 != 0) && (metrics_only == '\0')) &&
       (height = ft_glyphslot_alloc_bitmap((decoder->face->root).glyph,size_00), height == 0)) {
      decoder->bitmap_allocated = '\x01';
    }
  }
  return height;
}

Assistant:

static FT_Error
  tt_sbit_decoder_alloc_bitmap( TT_SBitDecoder  decoder,
                                FT_Bool         metrics_only )
  {
    FT_Error    error = FT_Err_Ok;
    FT_UInt     width, height;
    FT_Bitmap*  map = decoder->bitmap;
    FT_ULong    size;


    if ( !decoder->metrics_loaded )
    {
      error = FT_THROW( Invalid_Argument );
      goto Exit;
    }

    width  = decoder->metrics->width;
    height = decoder->metrics->height;

    map->width = width;
    map->rows  = height;

    switch ( decoder->bit_depth )
    {
    case 1:
      map->pixel_mode = FT_PIXEL_MODE_MONO;
      map->pitch      = (int)( ( map->width + 7 ) >> 3 );
      map->num_grays  = 2;
      break;

    case 2:
      map->pixel_mode = FT_PIXEL_MODE_GRAY2;
      map->pitch      = (int)( ( map->width + 3 ) >> 2 );
      map->num_grays  = 4;
      break;

    case 4:
      map->pixel_mode = FT_PIXEL_MODE_GRAY4;
      map->pitch      = (int)( ( map->width + 1 ) >> 1 );
      map->num_grays  = 16;
      break;

    case 8:
      map->pixel_mode = FT_PIXEL_MODE_GRAY;
      map->pitch      = (int)( map->width );
      map->num_grays  = 256;
      break;

    case 32:
      map->pixel_mode = FT_PIXEL_MODE_BGRA;
      map->pitch      = (int)( map->width * 4 );
      map->num_grays  = 256;
      break;

    default:
      error = FT_THROW( Invalid_File_Format );
      goto Exit;
    }

    size = map->rows * (FT_ULong)map->pitch;

    /* check that there is no empty image */
    if ( size == 0 )
      goto Exit;     /* exit successfully! */

    if ( metrics_only )
      goto Exit;     /* only metrics are requested */

    error = ft_glyphslot_alloc_bitmap( decoder->face->root.glyph, size );
    if ( error )
      goto Exit;

    decoder->bitmap_allocated = 1;

  Exit:
    return error;
  }